

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O0

int Scl_LibertyReadCellOutputNum(Scl_Tree_t *p,Scl_Item_t *pCell)

{
  int iVar1;
  char *pcVar2;
  int local_24;
  Scl_Item_t *pSStack_20;
  int Counter;
  Scl_Item_t *pPin;
  Scl_Item_t *pCell_local;
  Scl_Tree_t *p_local;
  
  local_24 = 0;
  for (pSStack_20 = Scl_LibertyItem(p,pCell->Child); pSStack_20 != (Scl_Item_t *)0x0;
      pSStack_20 = Scl_LibertyItem(p,pSStack_20->Next)) {
    iVar1 = Scl_LibertyCompare(p,pSStack_20->Key,"pin");
    if ((iVar1 == 0) && (pcVar2 = Scl_LibertyReadPinFormula(p,pSStack_20), pcVar2 != (char *)0x0)) {
      local_24 = local_24 + 1;
    }
  }
  return local_24;
}

Assistant:

int Scl_LibertyReadCellOutputNum( Scl_Tree_t * p, Scl_Item_t * pCell )
{
    Scl_Item_t * pPin;
    int Counter = 0;
    Scl_ItemForEachChildName( p, pCell, pPin, "pin" )
        if ( Scl_LibertyReadPinFormula(p, pPin) )
            Counter++;
    return Counter;
}